

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

uint64_t sum_quotients<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)1>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)1> *div)

{
  uint uVar1;
  uint64_t yl;
  long lVar2;
  uint uVar3;
  uint64_t xl;
  int iVar4;
  
  uVar3 = 0;
  for (lVar2 = 0; (ulong)vals->_length << 2 != lVar2; lVar2 = lVar2 + 4) {
    uVar1 = *(uint *)((long)vals->_pData + lVar2);
    iVar4 = (int)((ulong)uVar1 * (ulong)(div->div).denom.magic >> 0x20);
    uVar3 = uVar3 + ((uVar1 - iVar4 >> 1) + iVar4 >> ((div->div).denom.more & 0x1f));
  }
  return (ulong)uVar3;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}